

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  size_t *this;
  ostream *poVar1;
  exception *e;
  list<CCard,_std::allocator<CCard>_> local_c0;
  solution_t local_a4;
  solution_t s;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  deck_t second;
  deck_t first;
  
  this = &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size;
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            ((list<CCard,_std::allocator<CCard>_> *)this);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            ((list<CCard,_std::allocator<CCard>_> *)local_40);
  read_deck((deck_t *)this);
  read_deck((deck_t *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"first player",&local_71);
  dump_deck(&local_70,
            (deck_t *)
            &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s.second,"second player",(allocator<char> *)((long)&s.first + 3));
  dump_deck((string *)&s.second,(deck_t *)local_40);
  std::__cxx11::string::~string((string *)&s.second);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s.first + 3));
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            (&local_c0,
             (list<CCard,_std::allocator<CCard>_> *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            ((list<CCard,_std::allocator<CCard>_> *)&e,
             (list<CCard,_std::allocator<CCard>_> *)local_40);
  local_a4 = solve(&local_c0,(deck_t *)&e);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::~list
            ((list<CCard,_std::allocator<CCard>_> *)&e);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::~list(&local_c0);
  poVar1 = std::operator<<((ostream *)&std::cerr,"solution has been found");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (local_a4.first - 1U < 2) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_a4.first);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_a4.second);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"PAT");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::~list
            ((list<CCard,_std::allocator<CCard>_> *)local_40);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::~list
            ((list<CCard,_std::allocator<CCard>_> *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  return 0;
}

Assistant:

int main()
{
    try
    {
    	deck_t first;
    	deck_t second;
    	
    	read_deck(first);
    	read_deck(second);

        dump_deck("first player", first);
        dump_deck("second player", second);
    	
    	solution_t s = solve(first, second);
    	std::cerr << "solution has been found" << std::endl;
    	
    	switch (s.first)
    	{
    	    case 1:
    	    case 2:
    	        std::cout << s.first << " " << s.second << std::endl;
    	        break;
    
            default:	        
    	        std::cout << "PAT" << std::endl;
    	}
    }
    catch (const std::exception& e)
    {
        std::cerr << e.what() << std::endl;
    }
	
	return 0;
}